

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBAmrUtil.cpp
# Opt level: O2

void amrex::TagVolfrac(TagBoxArray *tags,MultiFab *volfrac,Real tol)

{
  long lVar1;
  long lVar2;
  long lVar3;
  Box local_12c;
  Array4<const_double> local_110;
  Array4<char> local_d0;
  MFIter mfi;
  
  MFIter::MFIter(&mfi,(FabArrayBase *)volfrac,true);
  while (mfi.currentIndex < mfi.endIndex) {
    MFIter::tilebox(&local_12c,&mfi);
    FabArray<amrex::TagBox>::array<amrex::TagBox,_0>
              (&local_d0,&tags->super_FabArray<amrex::TagBox>,&mfi);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_110,&volfrac->super_FabArray<amrex::FArrayBox>,&mfi);
    for (lVar1 = (long)local_12c.smallend.vect[2]; lVar2 = (long)local_12c.smallend.vect[1],
        (int)lVar1 <= local_12c.bigend.vect[2]; lVar1 = lVar1 + 1) {
      for (; lVar3 = (long)local_12c.smallend.vect[0], (int)lVar2 <= local_12c.bigend.vect[1];
          lVar2 = lVar2 + 1) {
        for (; (int)lVar3 <= local_12c.bigend.vect[0]; lVar3 = lVar3 + 1) {
          if ((local_110.p
               [((lVar2 - local_110.begin.y) * local_110.jstride +
                (lVar1 - local_110.begin.z) * local_110.kstride + lVar3) - (long)local_110.begin.x]
               <= 1.0 - tol) &&
             (tol <= local_110.p
                     [((lVar2 - local_110.begin.y) * local_110.jstride +
                      (lVar1 - local_110.begin.z) * local_110.kstride + lVar3) -
                      (long)local_110.begin.x])) {
            local_d0.p
            [lVar3 + (((lVar2 - local_d0.begin.y) * local_d0.jstride +
                      (lVar1 - local_d0.begin.z) * local_d0.kstride) - (long)local_d0.begin.x)] =
                 '\x02';
          }
        }
      }
    }
    MFIter::operator++(&mfi);
  }
  MFIter::~MFIter(&mfi);
  return;
}

Assistant:

void
TagVolfrac (TagBoxArray& tags, const MultiFab& volfrac, Real tol)
{
    BL_PROFILE("amrex::TagVolfrac()");

//    const char clearval = TagBox::CLEAR;
    const char   tagval = TagBox::SET;

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(volfrac, TilingIfNotGPU()); mfi.isValid(); ++mfi) {
        const Box& bx = mfi.tilebox();
        Array4<char> const& tagarr = tags.array(mfi);
        Array4<Real const> const& volarr = volfrac.const_array(mfi);
        AMREX_HOST_DEVICE_FOR_3D ( bx, i, j, k,
        {
            if (volarr(i,j,k) <= (1.-tol) && volarr(i,j,k) >= tol) {
                tagarr(i,j,k) = tagval;
            }
        });
    }
}